

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_lights.cxx
# Opt level: O0

void __thiscall xray_re::xr_scene_lights::load(xr_scene_lights *this,xr_reader *r)

{
  bool bVar1;
  uint32_t uVar2;
  size_t sVar3;
  ulong uVar4;
  size_type sVar5;
  char *__lhs;
  pointer pxVar6;
  char *name;
  xr_token_vec_it end;
  xr_token_vec_it it;
  uint32_t count;
  uint16_t version;
  xr_reader *r_local;
  xr_scene_lights *this_local;
  
  xr_reader::r_chunk<unsigned_short>(r,0x1001,(unsigned_short *)((long)&it._M_current + 6));
  if (it._M_current._6_2_ != 0) {
    __assert_fail("version == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_lights.cxx"
                  ,0xb2,"virtual void xray_re::xr_scene_lights::load(xr_reader &)");
  }
  xr_scene_objects::load(&this->super_xr_scene_objects,r);
  xr_reader::r_chunk<unsigned_int>(r,0x1004,&this->m_flags);
  sVar3 = xr_reader::find_chunk(r,0x1006);
  if (sVar3 != 0) {
    xr_reader::r_u8(r);
    xr_reader::r_fvector2(r,&this->m_sun);
    xr_reader::debug_find_chunk(r);
  }
  it._M_current._0_4_ = 0;
  xr_reader::r_chunk<unsigned_int>(r,0x1003,(uint *)&it);
  sVar3 = xr_reader::find_chunk(r,0x1002);
  if (sVar3 != 0) {
    uVar4 = (ulong)(uint)it._M_current;
    sVar5 = std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>::size
                      (&this->m_controls);
    if (uVar4 != sVar5) {
      __assert_fail("count == m_controls.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_lights.cxx"
                    ,0xbe,"virtual void xray_re::xr_scene_lights::load(xr_reader &)");
    }
    end._M_current =
         (xr_token *)
         std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>::begin
                   (&this->m_controls);
    name = (char *)std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>::end
                             (&this->m_controls);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&end,(__normal_iterator<xray_re::xr_token_*,_std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>_>
                               *)&name);
      if (!bVar1) break;
      __lhs = xr_reader::skip_sz(r);
      pxVar6 = __gnu_cxx::
               __normal_iterator<xray_re::xr_token_*,_std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>_>
               ::operator->(&end);
      bVar1 = std::operator==(__lhs,&pxVar6->name);
      if (!bVar1) {
        __assert_fail("name == it->name",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_lights.cxx"
                      ,0xc2,"virtual void xray_re::xr_scene_lights::load(xr_reader &)");
      }
      uVar2 = xr_reader::r_u32(r);
      pxVar6 = __gnu_cxx::
               __normal_iterator<xray_re::xr_token_*,_std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>_>
               ::operator->(&end);
      pxVar6->id = uVar2;
      __gnu_cxx::
      __normal_iterator<xray_re::xr_token_*,_std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>_>
      ::operator++(&end);
    }
    xr_reader::debug_find_chunk(r);
  }
  return;
}

Assistant:

void xr_scene_lights::load(xr_reader& r)
{
	uint16_t version;
	r.r_chunk<uint16_t>(TOOLS_CHUNK_VERSION, version);
	xr_assert(version == 0);
	xr_scene_objects::load(r);
	r.r_chunk<uint32_t>(LIGHTS_CHUNK_COMMON_FLAGS, m_flags);
	if (r.find_chunk(LIGHTS_CHUNK_COMMON_SUN)) {
		r.r_u8();
		r.r_fvector2(m_sun);
		r.debug_find_chunk();
	}

	uint32_t count = 0;
	r.r_chunk<uint32_t>(LIGHTS_CHUNK_COMMON_COUNT, count);
	if (r.find_chunk(LIGHTS_CHUNK_COMMON_CONTROLS)) {
		xr_assert(count == m_controls.size());
		for (xr_token_vec_it it = m_controls.begin(), end = m_controls.end();
				it != end; ++it) {
			const char* name = r.skip_sz();
			xr_assert(name == it->name);
			it->id = r.r_u32();
		}
		r.debug_find_chunk();
	}
}